

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void kahanBabuskaNeumaierStepInt64(SumCtx *pSum,i64 iVal)

{
  i64 iSm;
  i64 iBig;
  i64 iVal_local;
  SumCtx *pSum_local;
  
  if ((iVal < -0xfffffffffffff) || (0xfffffffffffff < iVal)) {
    kahanBabuskaNeumaierStep(pSum,(double)(iVal - iVal % 0x4000));
    kahanBabuskaNeumaierStep(pSum,(double)(iVal % 0x4000));
  }
  else {
    kahanBabuskaNeumaierStep(pSum,(double)iVal);
  }
  return;
}

Assistant:

static void kahanBabuskaNeumaierStepInt64(volatile SumCtx *pSum, i64 iVal){
  if( iVal<=-4503599627370496LL || iVal>=+4503599627370496LL ){
    i64 iBig, iSm;
    iSm = iVal % 16384;
    iBig = iVal - iSm;
    kahanBabuskaNeumaierStep(pSum, iBig);
    kahanBabuskaNeumaierStep(pSum, iSm);
  }else{
    kahanBabuskaNeumaierStep(pSum, (double)iVal);
  }
}